

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

int fy_emit_common_document_end(fy_emitter *emit)

{
  fy_document_state *pfVar1;
  _Bool _Var2;
  fy_emitter_cfg_flags fVar3;
  bool bVar4;
  _Bool dem;
  fy_emitter_cfg_flags dem_flags;
  fy_emitter_cfg_flags flags;
  fy_document_state *fyds;
  fy_emitter *emit_local;
  
  fVar3 = emit->cfg->flags & (FYECF_DOC_END_MARK_ON|FYECF_DOC_END_MARK_OFF);
  if ((emit == (fy_emitter *)0x0) || (emit->fyds == (fy_document_state *)0x0)) {
    emit_local._4_4_ = -1;
  }
  else {
    pfVar1 = emit->fyds;
    if (emit->column != 0) {
      fy_emit_putc(emit,fyewt_linebreak,10);
      emit->flags = 3;
    }
    if (((fVar3 == FYECF_DOC_END_MARK_AUTO) && (((byte)pfVar1->field_0x1c >> 3 & 1) == 0)) ||
       (bVar4 = false, fVar3 == FYECF_DOC_END_MARK_ON)) {
      bVar4 = (emit->cfg->flags & FYECF_STRIP_DOC) == FYECF_DOC_END_MARK_AUTO;
    }
    _Var2 = fy_emit_is_json_mode(emit);
    if ((_Var2) || (!bVar4)) {
      emit->flags = emit->flags & 0xffffffef;
    }
    else {
      fy_emit_puts(emit,fyewt_document_indicator,"...");
      fy_emit_putc(emit,fyewt_linebreak,10);
      emit->flags = 3;
      emit->flags = emit->flags | 0x10;
    }
    emit->flags = emit->flags | 0x20;
    emit->fyds = (fy_document_state *)0x0;
    emit_local._4_4_ = 0;
  }
  return emit_local._4_4_;
}

Assistant:

int fy_emit_common_document_end(struct fy_emitter *emit) {
    const struct fy_document_state *fyds;
    enum fy_emitter_cfg_flags flags = emit->cfg->flags;
    enum fy_emitter_cfg_flags dem_flags = flags & FYECF_DOC_END_MARK(FYECF_DOC_END_MARK_MASK);
    bool dem;

    if (!emit || !emit->fyds)
        return -1;

    fyds = emit->fyds;

    if (emit->column != 0) {
        fy_emit_putc(emit, fyewt_linebreak, '\n');
        emit->flags = FYEF_WHITESPACE | FYEF_INDENTATION;
    }

    dem = ((dem_flags == FYECF_DOC_END_MARK_AUTO && !fyds->end_implicit) ||
           dem_flags == FYECF_DOC_END_MARK_ON) &&
          !(emit->cfg->flags & FYECF_STRIP_DOC);
    if (!fy_emit_is_json_mode(emit) && dem) {
        fy_emit_puts(emit, fyewt_document_indicator, "...");
        fy_emit_putc(emit, fyewt_linebreak, '\n');
        emit->flags = FYEF_WHITESPACE | FYEF_INDENTATION;
        emit->flags |= FYEF_HAD_DOCUMENT_END;
    } else
        emit->flags &= ~FYEF_HAD_DOCUMENT_END;

    /* mark that we did output a document earlier */
    emit->flags |= FYEF_HAD_DOCUMENT_OUTPUT;

    /* stop our association with the document */
    emit->fyds = NULL;

    return 0;
}